

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O1

bool okResize<int>(vector<int,_std::allocator<int>_> *use_vector,HighsInt dimension,int value)

{
  int local_c;
  
  local_c = value;
  std::vector<int,_std::allocator<int>_>::resize(use_vector,(long)dimension,&local_c);
  return true;
}

Assistant:

bool okResize(std::vector<T>& use_vector, HighsInt dimension, T value = T{}) {
  try {
    use_vector.resize(dimension, value);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okResize fails with %s\n", e.what());
    return false;
  }
  return true;
}